

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

ssize_t __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::send
          (RpcServerResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar1;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar2;
  long *plVar3;
  undefined4 in_register_00000034;
  long lVar4;
  ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> capTable;
  Array<unsigned_int> exports;
  Vector<int> fds;
  Array<unsigned_int> local_88;
  Array<int> local_70;
  ArrayBuilder<int> local_58;
  Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&> local_30;
  
  lVar4 = CONCAT44(in_register_00000034,__fd);
  pMVar1 = *(Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> **)(lVar4 + 0x28);
  pMVar2 = *(Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> **)(lVar4 + 0x30);
  capTable.size_ = (long)pMVar2 - (long)pMVar1 >> 4;
  local_58.endPtr = (int *)0x0;
  local_58.ptr = (int *)0x0;
  local_58.pos = (RemoveConst<int> *)0x0;
  local_58.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  local_30.ptr = (HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)
                 (lVar4 + 0x70);
  capTable.ptr = pMVar1;
  writeDescriptors(&local_88,*(RpcConnectionState **)(lVar4 + 8),capTable,
                   (Builder)*(StructBuilder *)(lVar4 + 0x48),(Vector<int> *)&local_58,&local_30);
  plVar3 = *(long **)(lVar4 + 0x18);
  kj::Vector<int>::releaseAsArray(&local_70,(Vector<int> *)&local_58);
  (**(code **)(*plVar3 + 8))(plVar3,&local_70);
  kj::Array<int>::~Array(&local_70);
  (**(code **)(**(long **)(lVar4 + 0x18) + 0x10))();
  if (pMVar2 != pMVar1) {
    this->connectionState = (RpcConnectionState *)local_88.ptr;
    (this->message).disposer = (Disposer *)local_88.size_;
    (this->message).ptr = (OutgoingRpcMessage *)local_88.disposer;
    local_88.ptr = (uint *)0x0;
    local_88.size_ = 0;
  }
  *(bool *)&(this->super_RpcServerResponse)._vptr_RpcServerResponse = pMVar2 != pMVar1;
  kj::Array<unsigned_int>::~Array(&local_88);
  kj::ArrayBuilder<int>::dispose(&local_58);
  return (ssize_t)this;
}

Assistant:

kj::Maybe<kj::Array<ExportId>> send() {
      // Send the response and return the export list.  Returns kj::none if there were no caps.
      // (Could return a non-null empty array if there were caps but none of them were exports.)

      // Build the cap table.
      auto capTable = this->capTable.getTable();
      kj::Vector<int> fds;
      auto exports = connectionState.writeDescriptors(
          capTable, payload, fds, resolutionsAtReturnTime);
      message->setFds(fds.releaseAsArray());

      message->send();
      if (capTable.size() == 0) {
        return kj::none;
      } else {
        return kj::mv(exports);
      }
    }